

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMCatalogue.cpp
# Opt level: O0

void __thiscall
ROM::Request::visit(Request *this,
                   function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
                   *add_item)

{
  anon_class_16_2_5a337cda local_a8;
  function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)> local_98;
  anon_class_8_1_11580f2e local_78;
  function<void_()> local_70;
  anon_class_16_2_5a337cda local_50;
  function<void_(ROM::Request::ListType,_unsigned_long)> local_40;
  int local_1c;
  function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
  *pfStack_18;
  int indentation_level;
  function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
  *add_item_local;
  Request *this_local;
  
  local_1c = 0;
  local_50.indentation_level = &local_1c;
  local_50.add_item = add_item;
  pfStack_18 = add_item;
  add_item_local =
       (function<void_(ROM::Request::LineItem,_ROM::Request::ListType,_int,_const_ROM::Description_*,_bool,_unsigned_long)>
        *)this;
  std::function<void(ROM::Request::ListType,unsigned_long)>::
  function<ROM::Request::visit(std::function<void(ROM::Request::LineItem,ROM::Request::ListType,int,ROM::Description_const*,bool,unsigned_long)>const&)const::__0,void>
            ((function<void(ROM::Request::ListType,unsigned_long)> *)&local_40,&local_50);
  local_78.indentation_level = &local_1c;
  std::function<void()>::
  function<ROM::Request::visit(std::function<void(ROM::Request::LineItem,ROM::Request::ListType,int,ROM::Description_const*,bool,unsigned_long)>const&)const::__1,void>
            ((function<void()> *)&local_70,&local_78);
  local_a8.add_item = pfStack_18;
  local_a8.indentation_level = &local_1c;
  std::function<void(ROM::Request::ListType,ROM::Description_const&,bool,unsigned_long)>::
  function<ROM::Request::visit(std::function<void(ROM::Request::LineItem,ROM::Request::ListType,int,ROM::Description_const*,bool,unsigned_long)>const&)const::__2,void>
            ((function<void(ROM::Request::ListType,ROM::Description_const&,bool,unsigned_long)> *)
             &local_98,&local_a8);
  Node::visit(&this->node,&local_40,&local_70,&local_98);
  std::function<void_(ROM::Request::ListType,_const_ROM::Description_&,_bool,_unsigned_long)>::
  ~function(&local_98);
  std::function<void_()>::~function(&local_70);
  std::function<void_(ROM::Request::ListType,_unsigned_long)>::~function(&local_40);
  return;
}

Assistant:

void Request::visit(
	const std::function<void(LineItem, ListType, int, const ROM::Description *, bool, size_t)> &add_item
) const {
	int indentation_level = 0;
	node.visit(
		[&indentation_level, &add_item] (ROM::Request::ListType type, size_t size) {
			add_item(LineItem::NewList, type, indentation_level, nullptr, false, size);
			++indentation_level;
		},
		[&indentation_level] {
			--indentation_level;
		},
		[&indentation_level, &add_item] (ROM::Request::ListType type, const ROM::Description &rom, bool is_optional, size_t remaining) {
			add_item(LineItem::Description, type, indentation_level, &rom, is_optional, remaining);
		}
	);
}